

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O2

bool32 __thiscall rw::AnimInterpolator::setCurrentAnim(AnimInterpolator *this,Animation *anim)

{
  int iVar1;
  AnimInterpolatorInfo *pAVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  BlendCB p_Var6;
  FILE *__stream;
  char *pcVar7;
  void *pvVar8;
  bool32 bVar9;
  int iVar10;
  Animation *pAVar11;
  long lVar12;
  Error _e;
  
  pAVar2 = anim->interpInfo;
  this->currentAnim = anim;
  this->currentTime = 0.0;
  if (this->maxInterpKeyFrameSize + 0x10 < pAVar2->interpKeyFrameSize) {
    _e.plugin = 0x1b;
    _e.code = 0x80000001;
    bVar9 = 0;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/anim.cpp",0xe6);
    __stream = _stderr;
    pcVar7 = dbgsprint(0x80000001,"interpolation frame too big");
    fprintf(__stream,"%s\n",pcVar7);
    setError(&_e);
  }
  else {
    this->currentInterpKeyFrameSize = pAVar2->interpKeyFrameSize;
    this->currentAnimKeyFrameSize = pAVar2->animKeyFrameSize;
    p_Var6 = pAVar2->blendCB;
    this->applyCB = pAVar2->applyCB;
    this->blendCB = p_Var6;
    uVar3 = *(undefined4 *)((long)&pAVar2->interpCB + 4);
    uVar4 = *(undefined4 *)&pAVar2->addCB;
    uVar5 = *(undefined4 *)((long)&pAVar2->addCB + 4);
    *(undefined4 *)&this->interpCB = *(undefined4 *)&pAVar2->interpCB;
    *(undefined4 *)((long)&this->interpCB + 4) = uVar3;
    *(undefined4 *)&this->addCB = uVar4;
    *(undefined4 *)((long)&this->addCB + 4) = uVar5;
    iVar10 = 0;
    while( true ) {
      iVar1 = this->numNodes;
      if (iVar1 <= iVar10) break;
      lVar12 = (long)iVar10 * (long)this->currentInterpKeyFrameSize;
      pvVar8 = this->currentAnim->keyframes;
      pAVar11 = (Animation *)((long)(this->currentAnimKeyFrameSize * iVar10) + (long)pvVar8);
      pvVar8 = (void *)((long)((iVar1 + iVar10) * this->currentAnimKeyFrameSize) + (long)pvVar8);
      *(Animation **)((long)&this[1].currentAnim + lVar12) = pAVar11;
      *(void **)((long)&this[1].currentTime + lVar12) = pvVar8;
      if (this->interpCB != (InterpCB)0x0) {
        (*this->interpCB)((Animation **)((long)&this[1].currentAnim + lVar12),pAVar11,pvVar8,0.0,
                          anim->customData);
      }
      iVar10 = iVar10 + 1;
    }
    this->nextFrame =
         (void *)((long)iVar1 * (long)this->currentAnimKeyFrameSize * 2 +
                 (long)this->currentAnim->keyframes);
    bVar9 = 1;
  }
  return bVar9;
}

Assistant:

bool32
AnimInterpolator::setCurrentAnim(Animation *anim)
{
	int32 i;
	AnimInterpolatorInfo *interpInfo = anim->interpInfo;
	this->currentAnim = anim;
	this->currentTime = 0.0f;
	int32 maxkf = this->maxInterpKeyFrameSize;
	if(sizeof(void*) > 4)	// see above in create()
		maxkf += 16;
	if(interpInfo->interpKeyFrameSize > maxkf){
		RWERROR((ERR_GENERAL, "interpolation frame too big"));
		return 0;
	}
	this->currentInterpKeyFrameSize = interpInfo->interpKeyFrameSize;
	this->currentAnimKeyFrameSize = interpInfo->animKeyFrameSize;
	this->applyCB = interpInfo->applyCB;
	this->blendCB = interpInfo->blendCB;
	this->interpCB = interpInfo->interpCB;
	this->addCB = interpInfo->addCB;
	for(i = 0; i < numNodes; i++){
		InterpFrameHeader *intf;
		KeyFrameHeader *kf1, *kf2;
		intf = this->getInterpFrame(i);
		kf1 = this->getAnimFrame(i);
		kf2 = this->getAnimFrame(i+numNodes);
		intf->keyFrame1 = kf1;
		intf->keyFrame2 = kf2;
		// TODO: perhaps just implement all interpolator infos?
		if(this->interpCB)
			this->interpCB(intf, kf1, kf2, 0.0f, anim->customData);
	}
	this->nextFrame = this->getAnimFrame(numNodes*2);
	return 1;
}